

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_constants.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ValidateSpecConstantOp(ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  Feature *pFVar2;
  DiagnosticStream *pDVar3;
  char *local_5c0;
  DiagnosticStream local_5b8;
  DiagnosticStream local_3e0;
  char *local_208;
  DiagnosticStream local_200;
  Op local_24;
  Instruction *pIStack_20;
  Op op;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  pIStack_20 = inst;
  inst_local = (Instruction *)_;
  local_24 = val::Instruction::GetOperandAs<spv::Op>(inst,2);
  switch(local_24) {
  case OpAccessChain:
  case OpInBoundsAccessChain:
  case OpPtrAccessChain:
  case OpInBoundsPtrAccessChain:
  case OpConvertFToU:
  case OpConvertFToS:
  case OpConvertSToF:
  case OpConvertUToF:
  case OpConvertPtrToU:
  case OpConvertUToPtr:
  case OpPtrCastToGeneric:
  case OpGenericCastToPtr:
  case OpBitcast:
  case OpFNegate:
  case OpFAdd:
  case OpFSub:
  case OpFMul:
  case OpFDiv:
  case OpFRem:
  case OpFMod:
    bVar1 = ValidationState_t::HasCapability((ValidationState_t *)inst_local,CapabilityKernel);
    if (!bVar1) {
      ValidationState_t::diag
                (&local_5b8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
      pDVar3 = DiagnosticStream::operator<<
                         (&local_5b8,(char (*) [35])"Specialization constant operation ");
      local_5c0 = spvOpcodeString(local_24);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_5c0);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [28])" requires Kernel capability");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
      DiagnosticStream::~DiagnosticStream(&local_5b8);
      return __local._4_4_;
    }
    break;
  default:
    break;
  case OpUConvert:
    pFVar2 = ValidationState_t::features((ValidationState_t *)inst_local);
    if (((pFVar2->uconvert_spec_constant_op & 1U) == 0) &&
       (bVar1 = ValidationState_t::HasCapability((ValidationState_t *)inst_local,CapabilityKernel),
       !bVar1)) {
      ValidationState_t::diag
                (&local_3e0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
      pDVar3 = DiagnosticStream::operator<<
                         (&local_3e0,
                          (char (*) [129])
                          "Prior to SPIR-V 1.4, specialization constant operation UConvert requires Kernel capability or extension SPV_AMD_gpu_shader_int16"
                         );
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
      DiagnosticStream::~DiagnosticStream(&local_3e0);
      return __local._4_4_;
    }
    break;
  case OpQuantizeToF16:
    bVar1 = ValidationState_t::HasCapability((ValidationState_t *)inst_local,CapabilityShader);
    if (!bVar1) {
      ValidationState_t::diag
                (&local_200,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
      pDVar3 = DiagnosticStream::operator<<
                         (&local_200,(char (*) [35])"Specialization constant operation ");
      local_208 = spvOpcodeString(local_24);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_208);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [28])" requires Shader capability");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
      DiagnosticStream::~DiagnosticStream(&local_200);
      return __local._4_4_;
    }
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t ValidateSpecConstantOp(ValidationState_t& _,
                                    const Instruction* inst) {
  const auto op = inst->GetOperandAs<spv::Op>(2);

  // The binary parser already ensures that the op is valid for *some*
  // environment.  Here we check restrictions.
  switch (op) {
    case spv::Op::OpQuantizeToF16:
      if (!_.HasCapability(spv::Capability::Shader)) {
        return _.diag(SPV_ERROR_INVALID_ID, inst)
               << "Specialization constant operation " << spvOpcodeString(op)
               << " requires Shader capability";
      }
      break;

    case spv::Op::OpUConvert:
      if (!_.features().uconvert_spec_constant_op &&
          !_.HasCapability(spv::Capability::Kernel)) {
        return _.diag(SPV_ERROR_INVALID_ID, inst)
               << "Prior to SPIR-V 1.4, specialization constant operation "
                  "UConvert requires Kernel capability or extension "
                  "SPV_AMD_gpu_shader_int16";
      }
      break;

    case spv::Op::OpConvertFToS:
    case spv::Op::OpConvertSToF:
    case spv::Op::OpConvertFToU:
    case spv::Op::OpConvertUToF:
    case spv::Op::OpConvertPtrToU:
    case spv::Op::OpConvertUToPtr:
    case spv::Op::OpGenericCastToPtr:
    case spv::Op::OpPtrCastToGeneric:
    case spv::Op::OpBitcast:
    case spv::Op::OpFNegate:
    case spv::Op::OpFAdd:
    case spv::Op::OpFSub:
    case spv::Op::OpFMul:
    case spv::Op::OpFDiv:
    case spv::Op::OpFRem:
    case spv::Op::OpFMod:
    case spv::Op::OpAccessChain:
    case spv::Op::OpInBoundsAccessChain:
    case spv::Op::OpPtrAccessChain:
    case spv::Op::OpInBoundsPtrAccessChain:
      if (!_.HasCapability(spv::Capability::Kernel)) {
        return _.diag(SPV_ERROR_INVALID_ID, inst)
               << "Specialization constant operation " << spvOpcodeString(op)
               << " requires Kernel capability";
      }
      break;

    default:
      break;
  }

  // TODO(dneto): Validate result type and arguments to the various operations.
  return SPV_SUCCESS;
}